

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O3

int json_vunpack_ex(json_t *root,json_error_t *error,size_t flags,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  json_error_code code;
  char *msg;
  va_list ap_copy;
  scanner_t s;
  __va_list_tag local_c8;
  scanner_t local_b0;
  
  if (root == (json_t *)0x0) {
    jsonp_error_init(error,"<root>");
    msg = "NULL root value";
    code = json_error_null_value;
  }
  else {
    if ((fmt != (char *)0x0) && (*fmt != '\0')) {
      jsonp_error_init(error,(char *)0x0);
      local_b0.prev_token.line = 0;
      local_b0.prev_token.column = 0;
      local_b0.prev_token.pos = 0;
      local_b0.prev_token.token = '\0';
      local_b0.prev_token._17_7_ = 0;
      local_b0.token.line = 0;
      local_b0.token.column = 0;
      local_b0.token.pos = 0;
      local_b0.token.token = '\0';
      local_b0.token._17_7_ = 0;
      local_b0.next_token.line = 0;
      local_b0.next_token.column = 0;
      local_b0.next_token.pos = 0;
      local_b0.next_token.token = '\0';
      local_b0.next_token._17_7_ = 0;
      local_b0.line = 1;
      local_b0._108_8_ = 0;
      local_b0._116_8_ = 0;
      local_b0.start = fmt;
      local_b0.fmt = fmt;
      local_b0.error = error;
      local_b0.flags = flags;
      next_token(&local_b0);
      local_c8.reg_save_area = ap->reg_save_area;
      local_c8.gp_offset = ap->gp_offset;
      local_c8.fp_offset = ap->fp_offset;
      local_c8.overflow_arg_area = ap->overflow_arg_area;
      iVar1 = unpack(&local_b0,root,(va_list *)&local_c8);
      if (iVar1 == 0) {
        next_token(&local_b0);
        if (local_b0.token.token == '\0') {
          return 0;
        }
        set_error(&local_b0,"<format>",json_error_invalid_format,"Garbage after format string");
      }
      return -1;
    }
    jsonp_error_init(error,"<format>");
    msg = "NULL or empty format string";
    code = json_error_invalid_argument;
  }
  jsonp_error_set(error,-1,-1,0,code,msg);
  return -1;
}

Assistant:

int json_vunpack_ex(json_t *root, json_error_t *error, size_t flags, const char *fmt,
                    va_list ap) {
    scanner_t s;
    va_list ap_copy;

    if (!root) {
        jsonp_error_init(error, "<root>");
        jsonp_error_set(error, -1, -1, 0, json_error_null_value, "NULL root value");
        return -1;
    }

    if (!fmt || !*fmt) {
        jsonp_error_init(error, "<format>");
        jsonp_error_set(error, -1, -1, 0, json_error_invalid_argument,
                        "NULL or empty format string");
        return -1;
    }
    jsonp_error_init(error, NULL);

    scanner_init(&s, error, flags, fmt);
    next_token(&s);

    va_copy(ap_copy, ap);
    if (unpack(&s, root, &ap_copy)) {
        va_end(ap_copy);
        return -1;
    }
    va_end(ap_copy);

    next_token(&s);
    if (token(&s)) {
        set_error(&s, "<format>", json_error_invalid_format,
                  "Garbage after format string");
        return -1;
    }

    return 0;
}